

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O2

int __thiscall F2DDrawer::AddData(F2DDrawer *this,DataGeneric *data)

{
  uint uVar1;
  
  uVar1 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->mData,data->mLen);
  memcpy((this->mData).Array + (int)uVar1,data,(ulong)data->mLen);
  this->mLastLineCmd = -1;
  return uVar1;
}

Assistant:

int F2DDrawer::AddData(const F2DDrawer::DataGeneric *data)
{
	int addr = mData.Reserve(data->mLen);
	memcpy(&mData[addr], data, data->mLen);
	mLastLineCmd = -1;
	return addr;
}